

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageToPool
               (string_view name_prefix,Descriptor *message,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  Descriptor *this;
  _Alloc_hider _Var3;
  size_type sVar4;
  char cVar5;
  FieldDescriptor *pFVar6;
  long lVar7;
  _anonymous_namespace_ *this_00;
  size_t sVar8;
  OneofDescriptor *this_01;
  Descriptor *message_00;
  EnumDescriptor *en;
  pointer pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  int iVar11;
  FileDescriptor *in_R8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view classname;
  string_view name_prefix_00;
  undefined1 local_190 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_130 [48];
  Descriptor *local_100;
  int local_f4;
  undefined1 local_f0 [48];
  string local_c0;
  undefined1 local_90 [32];
  string local_70;
  string class_name;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x53) == '\0') {
    if ((pointer)name_prefix._M_len == (pointer)0x0) {
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    }
    else {
      local_160._M_dataplus._M_p = (pointer)0x1;
      local_160._M_string_length = 0x3471eb;
      local_190._0_8_ = (pointer)name_prefix._M_len;
      local_190._8_8_ = name_prefix._M_str;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,(AlphaNum *)local_190);
    }
    local_f0._0_8_ = local_90._8_8_;
    local_f0._8_8_ = local_90._0_8_;
    classname._M_str = *(char **)(message + 0x10);
    classname._M_len = **(size_t **)(message + 8);
    ReservedNamePrefix_abi_cxx11_(&local_70,(php *)(*(size_t **)(message + 8))[1],classname,in_R8);
    local_130._0_8_ = local_70._M_string_length;
    local_130._8_8_ = local_70._M_dataplus._M_p;
    local_c0._M_string_length = **(size_type **)(message + 8);
    local_c0._M_dataplus._M_p = (pointer)(*(size_type **)(message + 8))[1];
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&class_name,(AlphaNum *)local_f0,(AlphaNum *)local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    DescriptorFullName<google::protobuf::Descriptor>((string *)local_f0,message,true);
    text._M_str = 
    "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n";
    text._M_len = 0x4e;
    io::Printer::Print<char[8],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text,(char (*) [8])0x40ebb6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               (char (*) [11])0x45a608,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&class_name);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58) * 2;
    local_100 = message;
    if (0 < *(int *)(message + 4)) {
      iVar11 = 0;
      do {
        pFVar6 = Descriptor::field(local_100,iVar11);
        if (pFVar6[2] == (FieldDescriptor)0xb) {
          cVar5 = google::protobuf::FieldDescriptor::is_map_message_type();
          if (cVar5 == '\0') goto LAB_002f2733;
          google::protobuf::FieldDescriptor::message_type();
          lVar7 = google::protobuf::Descriptor::map_key();
          google::protobuf::FieldDescriptor::message_type();
          this_00 = (_anonymous_namespace_ *)google::protobuf::Descriptor::map_value();
          pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pFVar6 + 8);
          pcVar2 = (char *)(&FieldDescriptor::kTypeToName)[*(byte *)(lVar7 + 2)];
          sVar8 = strlen(pcVar2);
          local_190._0_8_ = local_190 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_190,pcVar2,pcVar2 + sVar8)
          ;
          absl::lts_20240722::AsciiStrToUpper((string *)local_190);
          pcVar2 = (char *)(&FieldDescriptor::kTypeToName)[(byte)this_00[2]];
          sVar8 = strlen(pcVar2);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_160,pcVar2,pcVar2 + sVar8);
          absl::lts_20240722::AsciiStrToUpper((string *)&local_160);
          pcVar2 = local_f0 + 0x10;
          lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*(int *)(pFVar6 + 4),pcVar2)
          ;
          local_f0._0_8_ = lVar7 - (long)pcVar2;
          pcVar9 = local_130 + 0x10;
          local_130._0_8_ = pcVar9;
          local_f0._8_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_130,pcVar2,lVar7);
          (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                    (&local_c0,this_00,field,SUB81(pcVar9,0));
          text_00._M_str =
               "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
          ;
          text_00._M_len = 0x78;
          io::Printer::
          Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,text_00,(char (*) [6])0x37da03,pbVar1,(char (*) [4])0x4698b2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     (char (*) [6])0x456267,&local_160,(char (*) [7])0x4746f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     (char (*) [6])"other",&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
            operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
          }
        }
        else {
LAB_002f2733:
          if (-1 < (char)pFVar6[3]) {
LAB_002f2778:
            (*(code *)(&DAT_00469c50 + *(int *)(&DAT_00469c50 + (ulong)((byte)pFVar6[1] >> 6) * 4)))
                      ();
            return;
          }
          if (((byte)pFVar6[1] & 0x10) == 0) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)(pFVar6 + 0x28);
            if (lVar7 == 0) {
              iVar11 = 0xa9a;
              goto LAB_002f2c97;
            }
          }
          if (lVar7 == 0) {
            iVar11 = 0xac6;
LAB_002f2c97:
            google::protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,iVar11);
          }
          if ((*(int *)(lVar7 + 4) == 1) && ((*(byte *)(*(long *)(lVar7 + 0x30) + 1) & 2) != 0)) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xac7,0x14,"!res->is_synthetic()");
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)local_f0);
          }
          if (-1 < (char)pFVar6[3]) goto LAB_002f2778;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)(local_100 + 4));
    }
    if (0 < *(int *)(local_100 + 0x7c)) {
      iVar11 = 0;
      do {
        local_f4 = iVar11;
        this_01 = Descriptor::oneof_decl(local_100,iVar11);
        text_01._M_str = "->oneof(^name^)\n";
        text_01._M_len = 0x10;
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,text_01,(char (*) [5])0x472c7f,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (this_01 + 8));
        *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58) * 2;
        if (0 < *(int *)(this_01 + 4)) {
          iVar11 = 0;
          do {
            pFVar6 = OneofDescriptor::field(this_01,iVar11);
            pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pFVar6 + 8);
            pcVar2 = (char *)(&FieldDescriptor::kTypeToName)[(byte)pFVar6[2]];
            sVar8 = strlen(pcVar2);
            local_190._0_8_ = local_190 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_190,pcVar2,pcVar2 + sVar8);
            absl::lts_20240722::AsciiStrToUpper((string *)local_190);
            pcVar2 = local_f0 + 0x10;
            lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                              (*(int *)(pFVar6 + 4),pcVar2);
            local_f0._0_8_ = lVar7 - (long)pcVar2;
            paVar10 = &local_160.field_2;
            local_160._M_dataplus._M_p = (pointer)paVar10;
            local_f0._8_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,pcVar2,lVar7);
            (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                      ((string *)local_130,(_anonymous_namespace_ *)pFVar6,field_00,SUB81(paVar10,0)
                      );
            text_02._M_str =
                 "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
            ;
            text_02._M_len = 0x4f;
            io::Printer::
            Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                      (printer,text_02,(char (*) [6])0x37da03,pbVar1,(char (*) [5])0x3eb4fc,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_190,(char (*) [7])0x4746f0,&local_160,(char (*) [6])"other",
                       (string *)local_130);
            if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
              operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
              operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 < *(int *)(this_01 + 4));
        }
        text_03._M_str = "->finish()\n";
        text_03._M_len = 0xb;
        io::Printer::Print<>(printer,text_03);
        google::protobuf::io::Printer::Outdent();
        google::protobuf::io::Printer::Outdent();
        iVar11 = local_f4 + 1;
      } while (iVar11 < *(int *)(local_100 + 0x7c));
    }
    text_04._M_str = "->finalizeToPool();\n";
    text_04._M_len = 0x14;
    io::Printer::Print<>(printer,text_04);
    google::protobuf::io::Printer::Outdent();
    google::protobuf::io::Printer::Outdent();
    text_05._M_str = "\n";
    text_05._M_len = 1;
    io::Printer::Print<>(printer,text_05);
    this = local_100;
    if (0 < *(int *)(local_100 + 0x80)) {
      iVar11 = 0;
      do {
        sVar4 = class_name._M_string_length;
        _Var3._M_p = class_name._M_dataplus._M_p;
        message_00 = Descriptor::nested_type(this,iVar11);
        name_prefix_00._M_str = _Var3._M_p;
        name_prefix_00._M_len = sVar4;
        GenerateMessageToPool(name_prefix_00,message_00,printer);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)(this + 0x80));
    }
    if (0 < *(int *)(this + 0x84)) {
      iVar11 = 0;
      do {
        en = Descriptor::enum_type(this,iVar11);
        GenerateEnumToPool(en,printer);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)(this + 0x84));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)class_name._M_dataplus._M_p != &class_name.field_2) {
      operator_delete(class_name._M_dataplus._M_p,class_name.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenerateMessageToPool(absl::string_view name_prefix,
                           const Descriptor* message, io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }
  std::string class_name = absl::StrCat(
      name_prefix.empty() ? "" : absl::StrCat(name_prefix, "\\"),
      ReservedNamePrefix(message->name(), message->file()), message->name());

  printer->Print(
      "$pool->addMessage('^message^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "message", DescriptorFullName(message, true), "class_name", class_name);

  Indent(printer);

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->is_map()) {
      const FieldDescriptor* key = field->message_type()->map_key();
      const FieldDescriptor* val = field->message_type()->map_value();
      printer->Print(
          "->map('^field^', \\Google\\Protobuf\\Internal\\GPBType::^key^, "
          "\\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n",
          "field", field->name(), "key",
          absl::AsciiStrToUpper(key->type_name()), "value",
          absl::AsciiStrToUpper(val->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(val, true));
    } else if (!field->real_containing_oneof()) {
      printer->Print(
          "->^label^('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "label", LabelForField(field), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
  }

  // oneofs.
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer->Print("->oneof(^name^)\n", "name", oneof->name());
    Indent(printer);
    for (int index = 0; index < oneof->field_count(); index++) {
      const FieldDescriptor* field = oneof->field(index);
      printer->Print(
          "->value('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
    printer->Print("->finish()\n");
    Outdent(printer);
  }

  printer->Print("->finalizeToPool();\n");

  Outdent(printer);

  printer->Print("\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageToPool(class_name, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumToPool(message->enum_type(i), printer);
  }
}